

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ObjPrint(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  char *pcVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  int local_24;
  int iFan_1;
  int i_1;
  int iFan;
  int i;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (pObj == (Gia_Obj_t *)0x0) {
    printf("Object is NULL.");
  }
  else {
    iVar1 = Gia_IsComplement(pObj);
    _iFan = pObj;
    if (iVar1 != 0) {
      printf("Compl ");
      _iFan = Gia_Not(pObj);
    }
    iVar1 = Gia_IsComplement(_iFan);
    if (iVar1 != 0) {
      __assert_fail("!Gia_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x51f,"void Gia_ObjPrint(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar2 = Gia_ObjId(p,_iFan);
    printf("Obj %4d : ",(ulong)uVar2);
    iVar1 = Gia_ObjIsConst0(_iFan);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsPi(p,_iFan);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsPo(p,_iFan);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCi(_iFan);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsCo(_iFan);
            if (iVar1 == 0) {
              iVar1 = Gia_ObjIsXor(_iFan);
              if (iVar1 == 0) {
                iVar1 = Gia_ObjId(p,_iFan);
                iVar1 = Gia_ObjIsMuxId(p,iVar1);
                if (iVar1 == 0) {
                  uVar2 = Gia_ObjFaninId0p(p,_iFan);
                  iVar1 = Gia_ObjFaninC0(_iFan);
                  pcVar8 = " ";
                  if (iVar1 != 0) {
                    pcVar8 = "\'";
                  }
                  uVar3 = Gia_ObjFaninId1p(p,_iFan);
                  iVar1 = Gia_ObjFaninC1(_iFan);
                  pcVar9 = " ";
                  if (iVar1 != 0) {
                    pcVar9 = "\'";
                  }
                  printf("AND( %4d%s, %4d%s )",(ulong)uVar2,pcVar8,(ulong)uVar3,pcVar9);
                }
                else {
                  uVar2 = Gia_ObjFaninId2p(p,_iFan);
                  iVar1 = Gia_ObjFaninC2(p,_iFan);
                  pcVar8 = " ";
                  if (iVar1 != 0) {
                    pcVar8 = "\'";
                  }
                  uVar3 = Gia_ObjFaninId1p(p,_iFan);
                  iVar1 = Gia_ObjFaninC1(_iFan);
                  pcVar9 = " ";
                  if (iVar1 != 0) {
                    pcVar9 = "\'";
                  }
                  uVar4 = Gia_ObjFaninId0p(p,_iFan);
                  iVar1 = Gia_ObjFaninC0(_iFan);
                  pcVar6 = " ";
                  if (iVar1 != 0) {
                    pcVar6 = "\'";
                  }
                  printf("MUX( %4d%s, %4d%s, %4d%s )",(ulong)uVar2,pcVar8,(ulong)uVar3,pcVar9,
                         (ulong)uVar4,pcVar6);
                }
              }
              else {
                uVar2 = Gia_ObjFaninId0p(p,_iFan);
                iVar1 = Gia_ObjFaninC0(_iFan);
                pcVar8 = " ";
                if (iVar1 != 0) {
                  pcVar8 = "\'";
                }
                uVar3 = Gia_ObjFaninId1p(p,_iFan);
                iVar1 = Gia_ObjFaninC1(_iFan);
                pcVar9 = " ";
                if (iVar1 != 0) {
                  pcVar9 = "\'";
                }
                printf("XOR( %4d%s, %4d%s )",(ulong)uVar2,pcVar8,(ulong)uVar3,pcVar9);
              }
            }
            else {
              uVar2 = Gia_ObjFaninId0p(p,_iFan);
              iVar1 = Gia_ObjFaninC0(_iFan);
              pcVar8 = " ";
              if (iVar1 != 0) {
                pcVar8 = "\'";
              }
              printf("RI( %4d%s )",(ulong)uVar2,pcVar8);
            }
          }
          else {
            pGVar5 = Gia_ObjRoToRi(p,_iFan);
            uVar2 = Gia_ObjFaninId0p(p,pGVar5);
            pGVar5 = Gia_ObjRoToRi(p,_iFan);
            iVar1 = Gia_ObjFaninC0(pGVar5);
            pcVar8 = " ";
            if (iVar1 != 0) {
              pcVar8 = "\'";
            }
            printf("RO( %4d%s )",(ulong)uVar2,pcVar8);
          }
        }
        else {
          uVar2 = Gia_ObjFaninId0p(p,_iFan);
          iVar1 = Gia_ObjFaninC0(_iFan);
          pcVar8 = " ";
          if (iVar1 != 0) {
            pcVar8 = "\'";
          }
          printf("PO( %4d%s )",(ulong)uVar2,pcVar8);
        }
      }
      else {
        printf("PI");
      }
    }
    else {
      printf("constant 0");
    }
    if (p->pRefs != (int *)0x0) {
      uVar2 = Gia_ObjRefNum(p,_iFan);
      printf(" (refs = %3d)",(ulong)uVar2);
    }
    if ((*(ulong *)_iFan >> 0x1e & 1) != 0) {
      printf(" mark0");
    }
    if ((*(ulong *)_iFan >> 0x3e & 1) != 0) {
      printf(" mark1");
    }
    iVar1 = Gia_ManHasMapping(p);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjId(p,_iFan);
      iVar1 = Gia_ObjIsLut(p,iVar1);
      if (iVar1 != 0) {
        printf(" Cut = { ");
        i_1 = 0;
        while( true ) {
          iVar1 = Gia_ObjId(p,_iFan);
          iVar1 = Gia_ObjLutSize(p,iVar1);
          if (iVar1 <= i_1) break;
          iVar1 = Gia_ObjId(p,_iFan);
          piVar7 = Gia_ObjLutFanins(p,iVar1);
          printf("%d ",(ulong)(uint)piVar7[i_1]);
          i_1 = i_1 + 1;
        }
        printf("}");
      }
    }
    iVar1 = Gia_ManHasMapping2(p);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjId(p,_iFan);
      iVar1 = Gia_ObjIsLut2(p,iVar1);
      if (iVar1 != 0) {
        printf(" Cut = { ");
        local_24 = 0;
        while( true ) {
          iVar1 = Gia_ObjId(p,_iFan);
          iVar1 = Gia_ObjLutSize2(p,iVar1);
          if (iVar1 <= local_24) break;
          iVar1 = Gia_ObjId(p,_iFan);
          uVar2 = Gia_ObjLutFanin2(p,iVar1,local_24);
          printf("%d ",(ulong)uVar2);
          local_24 = local_24 + 1;
        }
        printf("}");
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Gia_ObjPrint( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( pObj == NULL )
    {
        printf( "Object is NULL." );
        return;
    }
    if ( Gia_IsComplement(pObj) )
    {
        printf( "Compl " );
        pObj = Gia_Not(pObj);
    }
    assert( !Gia_IsComplement(pObj) );
    printf( "Obj %4d : ", Gia_ObjId(p, pObj) );
    if ( Gia_ObjIsConst0(pObj) )
        printf( "constant 0" );
    else if ( Gia_ObjIsPi(p, pObj) )
        printf( "PI" );
    else if ( Gia_ObjIsPo(p, pObj) )
        printf( "PO( %4d%s )", Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Gia_ObjIsCi(pObj) )
        printf( "RO( %4d%s )", Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)), (Gia_ObjFaninC0(Gia_ObjRoToRi(p, pObj))? "\'" : " ") );
    else if ( Gia_ObjIsCo(pObj) )
        printf( "RI( %4d%s )", Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
//    else if ( Gia_ObjIsBuf(pObj) )
//        printf( "BUF( %d%s )", Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Gia_ObjIsXor(pObj) )
        printf( "XOR( %4d%s, %4d%s )", 
            Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " "), 
            Gia_ObjFaninId1p(p, pObj), (Gia_ObjFaninC1(pObj)? "\'" : " ") );
    else if ( Gia_ObjIsMuxId(p, Gia_ObjId(p, pObj)) )
        printf( "MUX( %4d%s, %4d%s, %4d%s )", 
            Gia_ObjFaninId2p(p, pObj), (Gia_ObjFaninC2(p, pObj)? "\'" : " "), 
            Gia_ObjFaninId1p(p, pObj), (Gia_ObjFaninC1(pObj)? "\'" : " "), 
            Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %4d%s, %4d%s )", 
            Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " "), 
            Gia_ObjFaninId1p(p, pObj), (Gia_ObjFaninC1(pObj)? "\'" : " ") );
    if ( p->pRefs )
        printf( " (refs = %3d)", Gia_ObjRefNum(p, pObj) );
    if ( pObj->fMark0 )
        printf( " mark0" );
    if ( pObj->fMark1 )
        printf( " mark1" );
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, Gia_ObjId(p, pObj)) )
    {
        int i, iFan;
        printf( " Cut = { " );
        Gia_LutForEachFanin( p, Gia_ObjId(p, pObj), iFan, i )
            printf( "%d ", iFan );
        printf( "}" );
    }
    if ( Gia_ManHasMapping2(p) && Gia_ObjIsLut2(p, Gia_ObjId(p, pObj)) )
    {
        int i, iFan;
        printf( " Cut = { " );
        Gia_LutForEachFanin2( p, Gia_ObjId(p, pObj), iFan, i )
            printf( "%d ", iFan );
        printf( "}" );
    }
    printf( "\n" );
/*
    if ( p->pRefs )
    {
        Gia_Obj_t * pFanout;
        int i;
        int iFan = -1; // Suppress "might be used uninitialized"
        printf( "\nFanouts:\n" );
        Gia_ObjForEachFanout( p, pObj, pFanout, iFan, i )
        {
            printf( "    " );
            printf( "Node %4d : ", Gia_ObjId(pFanout) );
            if ( Gia_ObjIsPo(pFanout) )
                printf( "PO( %4d%s )", Gia_ObjFanin0(pFanout)->Id, (Gia_ObjFaninC0(pFanout)? "\'" : " ") );
            else if ( Gia_ObjIsBuf(pFanout) )
                printf( "BUF( %d%s )", Gia_ObjFanin0(pFanout)->Id, (Gia_ObjFaninC0(pFanout)? "\'" : " ") );
            else
                printf( "AND( %4d%s, %4d%s )", 
                    Gia_ObjFanin0(pFanout)->Id, (Gia_ObjFaninC0(pFanout)? "\'" : " "), 
                    Gia_ObjFanin1(pFanout)->Id, (Gia_ObjFaninC1(pFanout)? "\'" : " ") );
            printf( "\n" );
        }
        return;
    }
*/
}